

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O1

void update_sharpness(loop_filter_info_n *lfi,int sharpness_lvl)

{
  char cVar1;
  uint8_t *puVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  puVar2 = lfi->lfthr[0].lim;
  cVar1 = '\x04';
  lVar3 = 0;
  do {
    uVar4 = (uint)lVar3 >> (4 < sharpness_lvl) + (0 < sharpness_lvl);
    uVar5 = 9U - sharpness_lvl;
    if ((int)uVar4 < (int)(9U - sharpness_lvl)) {
      uVar5 = uVar4;
    }
    if (sharpness_lvl < 1) {
      uVar5 = uVar4;
    }
    if ((int)uVar5 < 2) {
      uVar5 = 1;
    }
    uVar11 = (undefined1)(uVar5 >> 0x18);
    uVar10 = (undefined1)(uVar5 >> 0x10);
    uVar9 = (undefined1)(uVar5 >> 8);
    auVar8._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar11,uVar11),uVar10),CONCAT14(uVar10,uVar5))
                        >> 0x20);
    auVar8[3] = uVar9;
    auVar8[2] = uVar9;
    auVar8[0] = (char)uVar5;
    auVar8[1] = auVar8[0];
    auVar8._8_8_ = 0;
    auVar7 = pshuflw(auVar8,auVar8,0);
    uVar6 = auVar7._0_4_;
    *(undefined4 *)puVar2 = uVar6;
    *(undefined4 *)(puVar2 + 4) = uVar6;
    *(undefined4 *)(puVar2 + 8) = uVar6;
    *(undefined4 *)(puVar2 + 0xc) = uVar6;
    auVar8 = ZEXT216(CONCAT11(auVar8[0] + cVar1,auVar8[0] + cVar1));
    auVar8 = pshuflw(auVar8,auVar8,0);
    uVar6 = auVar8._0_4_;
    *(undefined4 *)((loop_filter_thresh *)(puVar2 + -0x10))->mblim = uVar6;
    *(undefined4 *)(puVar2 + -0xc) = uVar6;
    *(undefined4 *)(puVar2 + -8) = uVar6;
    *(undefined4 *)(puVar2 + -4) = uVar6;
    lVar3 = lVar3 + 1;
    cVar1 = cVar1 + '\x02';
    puVar2 = puVar2 + 0x30;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

static void update_sharpness(loop_filter_info_n *lfi, int sharpness_lvl) {
  int lvl;

  // For each possible value for the loop filter fill out limits
  for (lvl = 0; lvl <= MAX_LOOP_FILTER; lvl++) {
    // Set loop filter parameters that control sharpness.
    int block_inside_limit = lvl >> ((sharpness_lvl > 0) + (sharpness_lvl > 4));

    if (sharpness_lvl > 0) {
      if (block_inside_limit > (9 - sharpness_lvl))
        block_inside_limit = (9 - sharpness_lvl);
    }

    if (block_inside_limit < 1) block_inside_limit = 1;

    memset(lfi->lfthr[lvl].lim, block_inside_limit, SIMD_WIDTH);
    memset(lfi->lfthr[lvl].mblim, (2 * (lvl + 2) + block_inside_limit),
           SIMD_WIDTH);
  }
}